

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

StringRef llvm::dwarf::AttributeEncodingString(uint Encoding)

{
  undefined1 auStack_18 [4];
  uint Encoding_local;
  
  switch(Encoding) {
  case 1:
    StringRef::StringRef((StringRef *)auStack_18,"DW_ATE_address");
    break;
  case 2:
    StringRef::StringRef((StringRef *)auStack_18,"DW_ATE_boolean");
    break;
  case 3:
    StringRef::StringRef((StringRef *)auStack_18,"DW_ATE_complex_float");
    break;
  case 4:
    StringRef::StringRef((StringRef *)auStack_18,"DW_ATE_float");
    break;
  case 5:
    StringRef::StringRef((StringRef *)auStack_18,"DW_ATE_signed");
    break;
  case 6:
    StringRef::StringRef((StringRef *)auStack_18,"DW_ATE_signed_char");
    break;
  case 7:
    StringRef::StringRef((StringRef *)auStack_18,"DW_ATE_unsigned");
    break;
  case 8:
    StringRef::StringRef((StringRef *)auStack_18,"DW_ATE_unsigned_char");
    break;
  case 9:
    StringRef::StringRef((StringRef *)auStack_18,"DW_ATE_imaginary_float");
    break;
  case 10:
    StringRef::StringRef((StringRef *)auStack_18,"DW_ATE_packed_decimal");
    break;
  case 0xb:
    StringRef::StringRef((StringRef *)auStack_18,"DW_ATE_numeric_string");
    break;
  case 0xc:
    StringRef::StringRef((StringRef *)auStack_18,"DW_ATE_edited");
    break;
  case 0xd:
    StringRef::StringRef((StringRef *)auStack_18,"DW_ATE_signed_fixed");
    break;
  case 0xe:
    StringRef::StringRef((StringRef *)auStack_18,"DW_ATE_unsigned_fixed");
    break;
  case 0xf:
    StringRef::StringRef((StringRef *)auStack_18,"DW_ATE_decimal_float");
    break;
  case 0x10:
    StringRef::StringRef((StringRef *)auStack_18,"DW_ATE_UTF");
    break;
  case 0x11:
    StringRef::StringRef((StringRef *)auStack_18,"DW_ATE_UCS");
    break;
  case 0x12:
    StringRef::StringRef((StringRef *)auStack_18,"DW_ATE_ASCII");
    break;
  default:
    memset(auStack_18,0,0x10);
    StringRef::StringRef((StringRef *)auStack_18);
  }
  return _auStack_18;
}

Assistant:

StringRef llvm::dwarf::AttributeEncodingString(unsigned Encoding) {
  switch (Encoding) {
  default:
    return StringRef();
#define HANDLE_DW_ATE(ID, NAME, VERSION, VENDOR)                               \
  case DW_ATE_##NAME:                                                          \
    return "DW_ATE_" #NAME;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}